

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264d_vdpu383.c
# Opt level: O0

MPP_RET vdpu383_h264d_init(void *hal,MppHalCfg *cfg)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  uint local_40;
  RK_U32 i;
  RK_U32 max_cnt;
  Vdpu383H264dRegCtx *reg_ctx;
  H264dHalCtx_t *p_hal;
  MPP_RET ret;
  MppHalCfg *cfg_local;
  void *hal_local;
  
  if (hal == (void *)0x0) {
    if ((hal_h264d_debug & 4) != 0) {
      _mpp_log_l(4,"hal_h264d_vdpu383","input empty(%d).\n",(char *)0x0,0x27a);
    }
LAB_00238384:
    hal_local._4_4_ = MPP_OK;
  }
  else {
    pvVar4 = mpp_osal_calloc("vdpu383_h264d_init",0x4d8);
    *(void **)((long)hal + 0x90) = pvVar4;
    if (pvVar4 == (void *)0x0) {
      p_hal._4_4_ = MPP_ERR_MALLOC;
      if ((hal_h264d_debug & 1) != 0) {
        _mpp_log_l(4,"hal_h264d_vdpu383","malloc buffer error(%d).\n",(char *)0x0,0x27d);
      }
      if (((hal_h264d_debug & 2) != 0) &&
         (_mpp_log_l(2,"hal_h264d_vdpu383","Assertion %s failed at %s:%d\n",(char *)0x0,"0",
                     "vdpu383_h264d_init",0x27d), (mpp_debug & 0x10000000) != 0)) {
        abort();
      }
    }
    else {
      lVar1 = *(long *)((long)hal + 0x90);
      uVar2 = 1;
      if (*(int *)((long)hal + 0x98) != 0) {
        uVar2 = 3;
      }
      p_hal._4_4_ = mpp_buffer_get_with_tag
                              (*(MppBufferGroup *)((long)hal + 0x68),(MppBuffer *)(lVar1 + 0x390),
                               (ulong)(uVar2 * 0x3000 + 0x1000),"hal_h264d_vdpu383",
                               "vdpu383_h264d_init");
      if (MPP_NOK < p_hal._4_4_) {
        iVar3 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)(lVar1 + 0x390),"vdpu383_h264d_init");
        *(int *)(lVar1 + 0x398) = iVar3;
        pvVar4 = mpp_buffer_get_ptr_with_caller(*(MppBuffer *)(lVar1 + 0x390),"vdpu383_h264d_init");
        *(void **)(lVar1 + 0x3a0) = pvVar4;
        *(undefined4 *)(lVar1 + 0x3a8) = 0;
        *(undefined4 *)(lVar1 + 0x3ac) = 0x1000;
        for (local_40 = 0; local_40 < uVar2; local_40 = local_40 + 1) {
          pvVar4 = mpp_osal_calloc("vdpu383_h264d_init",0x298);
          *(void **)(lVar1 + (ulong)local_40 * 0x10 + 0x3e0) = pvVar4;
          init_ctrl_regs(*(Vdpu383H264dRegSet **)(lVar1 + (ulong)local_40 * 0x10 + 0x3e0));
          *(uint *)(lVar1 + 0x3b0 + (ulong)local_40 * 4) = local_40 * 0x3000 + 0x1000;
          *(uint *)(lVar1 + 0x3bc + (ulong)local_40 * 4) = local_40 * 0x3000 + 0x2000;
          *(uint *)(lVar1 + 0x3c8 + (ulong)local_40 * 4) = local_40 * 0x3000 + 0x3000;
        }
        mpp_buffer_attach_dev_f
                  ("vdpu383_h264d_init",*(MppBuffer *)(lVar1 + 0x390),*(MppDev *)((long)hal + 0x88))
        ;
        if (*(int *)((long)hal + 0x98) == 0) {
          *(undefined8 *)(lVar1 + 0x4c8) = *(undefined8 *)(lVar1 + 0x3e0);
          *(undefined4 *)(lVar1 + 0x408) = *(undefined4 *)(lVar1 + 0x3b0);
          *(undefined4 *)(lVar1 + 0x40c) = *(undefined4 *)(lVar1 + 0x3bc);
          *(undefined4 *)(lVar1 + 0x410) = *(undefined4 *)(lVar1 + 0x3c8);
        }
        memcpy((void *)(*(long *)(lVar1 + 0x3a0) + (ulong)*(uint *)(lVar1 + 0x3a8)),h264_cabac_table
               ,0xe80);
        mpp_slots_set_prop(*(MppBufSlots *)((long)hal + 0x50),SLOTS_HOR_ALIGN,
                           mpp_align_128_odd_plus_64);
        mpp_slots_set_prop(*(MppBufSlots *)((long)hal + 0x50),SLOTS_VER_ALIGN,rkv_ver_align);
        mpp_slots_set_prop(*(MppBufSlots *)((long)hal + 0x50),SLOTS_LEN_ALIGN,rkv_len_align);
        if (cfg->hal_fbc_adj_cfg != (SlotHalFbcAdjCfg *)0x0) {
          cfg->hal_fbc_adj_cfg->func = vdpu383_afbc_align_calc;
          cfg->hal_fbc_adj_cfg->expand = 0x10;
        }
        goto LAB_00238384;
      }
      if ((hal_h264d_debug & 4) != 0) {
        _mpp_log_l(4,"hal_h264d_vdpu383","Function error(%d).\n",(char *)0x0,0x284);
      }
    }
    vdpu383_h264d_deinit(hal);
    hal_local._4_4_ = p_hal._4_4_;
  }
  return hal_local._4_4_;
}

Assistant:

MPP_RET vdpu383_h264d_init(void *hal, MppHalCfg *cfg)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    H264dHalCtx_t *p_hal = (H264dHalCtx_t *)hal;

    INP_CHECK(ret, NULL == p_hal);
    (void) cfg;

    MEM_CHECK(ret, p_hal->reg_ctx = mpp_calloc_size(void, sizeof(Vdpu383H264dRegCtx)));
    Vdpu383H264dRegCtx *reg_ctx = (Vdpu383H264dRegCtx *)p_hal->reg_ctx;
    RK_U32 max_cnt = p_hal->fast_mode ? VDPU383_FAST_REG_SET_CNT : 1;
    RK_U32 i = 0;

    //!< malloc buffers
    FUN_CHECK(ret = mpp_buffer_get(p_hal->buf_group, &reg_ctx->bufs,
                                   VDPU383_INFO_BUFFER_SIZE(max_cnt)));
    reg_ctx->bufs_fd = mpp_buffer_get_fd(reg_ctx->bufs);
    reg_ctx->bufs_ptr = mpp_buffer_get_ptr(reg_ctx->bufs);
    reg_ctx->offset_cabac = VDPU383_CABAC_TAB_OFFSET;
    reg_ctx->offset_errinfo = VDPU383_ERROR_INFO_OFFSET;
    for (i = 0; i < max_cnt; i++) {
        reg_ctx->reg_buf[i].regs = mpp_calloc(Vdpu383H264dRegSet, 1);
        init_ctrl_regs(reg_ctx->reg_buf[i].regs);
        reg_ctx->offset_spspps[i] = VDPU383_SPSPPS_OFFSET(i);
        reg_ctx->offset_rps[i] = VDPU383_RPS_OFFSET(i);
        reg_ctx->offset_sclst[i] = VDPU383_SCALING_LIST_OFFSET(i);
    }

    mpp_buffer_attach_dev(reg_ctx->bufs, p_hal->dev);

    if (!p_hal->fast_mode) {
        reg_ctx->regs = reg_ctx->reg_buf[0].regs;
        reg_ctx->spspps_offset = reg_ctx->offset_spspps[0];
        reg_ctx->rps_offset = reg_ctx->offset_rps[0];
        reg_ctx->sclst_offset = reg_ctx->offset_sclst[0];
    }

    //!< copy cabac table bytes
    memcpy((char *)reg_ctx->bufs_ptr + reg_ctx->offset_cabac,
           (void *)h264_cabac_table, sizeof(h264_cabac_table));

    mpp_slots_set_prop(p_hal->frame_slots, SLOTS_HOR_ALIGN, mpp_align_128_odd_plus_64);
    mpp_slots_set_prop(p_hal->frame_slots, SLOTS_VER_ALIGN, rkv_ver_align);
    mpp_slots_set_prop(p_hal->frame_slots, SLOTS_LEN_ALIGN, rkv_len_align);

    if (cfg->hal_fbc_adj_cfg) {
        cfg->hal_fbc_adj_cfg->func = vdpu383_afbc_align_calc;
        cfg->hal_fbc_adj_cfg->expand = 16;
    }

__RETURN:
    return MPP_OK;
__FAILED:
    vdpu383_h264d_deinit(hal);

    return ret;
}